

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

long mem_seek(jas_stream_obj_t *obj,long offset,int origin)

{
  int iVar1;
  long local_38;
  ssize_t newpos;
  jas_stream_memobj_t *m;
  int origin_local;
  long offset_local;
  jas_stream_obj_t *obj_local;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("mem_seek(%p, %ld, %d)\n",obj,offset,(ulong)(uint)origin);
  }
  local_38 = offset;
  if (origin != 0) {
    if (origin == 1) {
      local_38 = *(long *)((long)obj + 0x18) + offset;
    }
    else {
      if (origin != 2) {
        abort();
      }
      local_38 = *(long *)((long)obj + 0x10) - offset;
    }
  }
  if (local_38 < 0) {
    obj_local = (jas_stream_obj_t *)0xffffffffffffffff;
  }
  else {
    *(long *)((long)obj + 0x18) = local_38;
    obj_local = *(jas_stream_obj_t **)((long)obj + 0x18);
  }
  return (long)obj_local;
}

Assistant:

static long mem_seek(jas_stream_obj_t *obj, long offset, int origin)
{
	jas_stream_memobj_t *m = (jas_stream_memobj_t *)obj;
	ssize_t newpos;

	JAS_DBGLOG(100, ("mem_seek(%p, %ld, %d)\n", obj, offset, origin));
	switch (origin) {
	case SEEK_SET:
		newpos = offset;
		break;
	case SEEK_END:
		newpos = m->len_ - offset;
		break;
	case SEEK_CUR:
		newpos = m->pos_ + offset;
		break;
	default:
		abort();
		break;
	}
	if (newpos < 0) {
		return -1;
	}
	m->pos_ = newpos;

	return m->pos_;
}